

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool __thiscall ON_NurbsCurve::GetCV(ON_NurbsCurve *this,int i,point_style style,double *Point)

{
  double *__src;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  
  if (this->m_cv == (double *)0x0) {
    return false;
  }
  __src = this->m_cv + i * this->m_cv_stride;
  iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if (this->m_is_rat == 0) {
    dVar5 = 1.0;
  }
  else {
    dVar5 = __src[iVar2];
  }
  if (3 < style - not_rational) goto LAB_0054e9b0;
  uVar4 = (ulong)iVar2;
  switch(style) {
  case homogeneous_rational:
    Point[uVar4] = dVar5;
    goto LAB_0054e9c7;
  case euclidean_rational:
    Point[uVar4] = dVar5;
    break;
  case intrinsic_point_style:
    uVar4 = 0;
    if (0 < this->m_dim) {
      uVar4 = (ulong)((this->m_dim + 1) - (uint)(this->m_is_rat == 0));
    }
LAB_0054e9c7:
    memcpy(Point,__src,uVar4 << 3);
    goto LAB_0054e9d6;
  }
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    for (lVar3 = 0; iVar2 != (int)lVar3; lVar3 = lVar3 + 1) {
      Point[lVar3] = __src[lVar3] * (1.0 / dVar5);
    }
LAB_0054e9d6:
    bVar1 = true;
  }
  else {
LAB_0054e9b0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

double* ON_NurbsCurve::CV( int i ) const
{
  return (m_cv) ? (m_cv + i*m_cv_stride) : nullptr;
}